

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O2

void Dtt_ManProcessVisited(Dtt_Man_t *p)

{
  Vec_Int_t *p_00;
  int iVar1;
  int i;
  
  i = 0;
  while( true ) {
    p_00 = p->vVisited;
    if (p_00->nSize <= i) {
      p_00->nSize = 0;
      return;
    }
    iVar1 = Vec_IntEntry(p_00,i);
    if (p->pVisited[iVar1] == '\0') break;
    p->pVisited[iVar1] = '\0';
    p->pTimes[iVar1] = p->pTimes[iVar1] + 1;
    i = i + 1;
  }
  __assert_fail("p->pVisited[Class]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                ,0x188,"void Dtt_ManProcessVisited(Dtt_Man_t *)");
}

Assistant:

void Dtt_ManProcessVisited( Dtt_Man_t * p )
{
    int i, Class;
    Vec_IntForEachEntry( p->vVisited, Class, i )
    {
        assert( p->pVisited[Class] );
        p->pVisited[Class] = 0;
        p->pTimes[Class]++;
    }
    Vec_IntClear( p->vVisited );
}